

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O3

void y_number_suite::y_number_real_capital_e_pos_exp(void)

{
  char input [7];
  reader reader;
  undefined4 local_174;
  view_type local_170;
  char local_160 [8];
  basic_reader<char> local_158;
  
  builtin_strncpy(local_160,"[1E+2]",7);
  local_170._M_len = strlen(local_160);
  local_170._M_str = local_160;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,&local_170);
  local_174 = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xbe6,"void y_number_suite::y_number_real_capital_e_pos_exp()",&local_170,&local_174);
  trial::protocol::json::basic_reader<char>::next(&local_158);
  local_170._M_len = CONCAT44(local_170._M_len._4_4_,local_158.decoder.current.code);
  local_174 = 9;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::real",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xbe8,"void y_number_suite::y_number_real_capital_e_pos_exp()",&local_170,&local_174);
  local_170._M_len =
       (long)local_158.decoder.current.view.tail - (long)local_158.decoder.current.view.head;
  local_170._M_str = local_158.decoder.current.view.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[5]>
            ("reader.literal()","\"1E+2\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xbe9,"void y_number_suite::y_number_real_capital_e_pos_exp()",&local_170,"1E+2");
  trial::protocol::json::basic_reader<char>::next(&local_158);
  local_174 = 0xd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xbeb,"void y_number_suite::y_number_real_capital_e_pos_exp()",&local_170,&local_174);
  trial::protocol::json::basic_reader<char>::next(&local_158);
  local_170._M_len = CONCAT44(local_170._M_len._4_4_,local_158.decoder.current.code);
  local_174 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xbed,"void y_number_suite::y_number_real_capital_e_pos_exp()",&local_170,&local_174);
  if (local_158.stack.c.
      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void y_number_real_capital_e_pos_exp()
{
    const char input[] = "[1E+2]";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::real);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "1E+2");
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}